

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downsize.cpp
# Opt level: O0

int downsize(string *f_input,string *f_output)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  ostream *poVar4;
  long lVar5;
  istream *piVar6;
  reference pbVar7;
  string local_4e8 [8];
  string n;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ofstream w_file;
  string local_2b0;
  string local_290;
  undefined1 local_270 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  content;
  string line;
  istream local_228 [8];
  ifstream r_file;
  string *f_output_local;
  string *f_input_local;
  
  std::ifstream::ifstream(local_228,(string *)f_input,_S_out);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Error: File ");
    poVar4 = std::operator<<(poVar4,(string *)f_input);
    poVar4 = std::operator<<(poVar4," does not exist");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    f_input_local._4_4_ = 1;
  }
  else {
    lVar5 = std::__cxx11::string::find((char *)f_input,0x110109);
    if (lVar5 == -1) {
      lVar5 = std::__cxx11::string::find((char *)f_input,0x11010e);
      if (lVar5 == -1) {
        lVar5 = std::__cxx11::string::find((char *)f_input,0x110113);
        if (lVar5 == -1) {
          lVar5 = std::__cxx11::string::find((char *)f_input,0x110118);
          if (lVar5 == -1) {
            poVar4 = std::operator<<((ostream *)&std::cout,"Error: File extension is not supported")
            ;
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            std::ifstream::close();
            f_input_local._4_4_ = 1;
            goto LAB_0010b5cc;
          }
        }
      }
    }
    std::__cxx11::string::string
              ((string *)
               &content.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_270);
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_228,
                          (string *)
                          &content.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      if (!bVar2) break;
      std::__cxx11::string::string
                ((string *)&local_2b0,
                 (string *)
                 &content.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      downsize_line(&local_290,&local_2b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_270,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    std::ifstream::close();
    _Var3 = std::operator|(_S_in,_S_trunc);
    std::ofstream::ofstream(&__range1,(string *)f_output,_Var3);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_270);
    n.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_270);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)((long)&n.field_2 + 8));
      if (!bVar2) break;
      pbVar7 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      std::__cxx11::string::string(local_4e8,(string *)pbVar7);
      std::operator<<((ostream *)&__range1,local_4e8);
      std::__cxx11::string::~string(local_4e8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::ofstream::close();
    f_input_local._4_4_ = 0;
    std::ofstream::~ofstream(&__range1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_270);
    std::__cxx11::string::~string
              ((string *)
               &content.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
LAB_0010b5cc:
  std::ifstream::~ifstream(local_228);
  return f_input_local._4_4_;
}

Assistant:

int downsize(const std::string f_input, const std::string f_output) {
    std::ifstream r_file(f_input, std::ios::out);
    if (!r_file.is_open()) {
        std::cout << "Error: File " << f_input << " does not exist" << std::endl;
        return EXIT_FAILURE;
    }
    if (
            (f_input.find(".sqf") == std::string::npos) &&
            (f_input.find(".hpp") == std::string::npos) &&
            (f_input.find(".ext") == std::string::npos) &&
            (f_input.find(".cpp") == std::string::npos)
        ) {
        std::cout << "Error: File extension is not supported" << std::endl;
        r_file.close();
        return EXIT_FAILURE;
    }

    std::string line;
    std::vector<std::string> content;
    while (getline(r_file, line)) {
        content.push_back(downsize_line(line));
    }
    r_file.close();

    std::ofstream w_file(f_output, std::ios::in | std::ios::trunc);
    for (std::string n : content) {
        w_file << n;
    }
    w_file.close();

    return EXIT_SUCCESS;
}